

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok.c
# Opt level: O1

void align_limit_to_full_utf8_characters(char *from,char **fromLimRef)

{
  char *pcVar1;
  long lVar2;
  byte bVar3;
  
  pcVar1 = *fromLimRef;
  if (from < pcVar1) {
    lVar2 = 0;
    do {
      bVar3 = pcVar1[-1];
      if ((bVar3 & 0xf8) == 0xf0) {
        if (lVar2 - 3U < 0xfffffffffffffffc) {
          pcVar1 = pcVar1 + 3;
          goto LAB_0048aa4b;
        }
LAB_0048aa4f:
        bVar3 = 1;
        lVar2 = 0;
      }
      else {
        if ((bVar3 & 0xf0) == 0xe0) {
          if (0xfffffffffffffffc < lVar2 - 2U) goto LAB_0048aa4f;
          pcVar1 = pcVar1 + 2;
        }
        else {
          if ((bVar3 & 0xe0) != 0xc0) {
            bVar3 = bVar3 >> 7;
            goto LAB_0048aa58;
          }
          if (0xfffffffffffffffd < lVar2 - 1U) goto LAB_0048aa4f;
          pcVar1 = pcVar1 + 1;
        }
LAB_0048aa4b:
        bVar3 = 0;
      }
LAB_0048aa58:
      if (bVar3 == 0) break;
      pcVar1 = pcVar1 + -1;
      lVar2 = lVar2 + 1;
    } while (from < pcVar1);
  }
  *fromLimRef = pcVar1;
  return;
}

Assistant:

void
align_limit_to_full_utf8_characters(const char * from, const char ** fromLimRef)
{
  const char * fromLim = *fromLimRef;
  size_t walked = 0;
  for (; fromLim > from; fromLim--, walked++) {
    const unsigned char prev = (unsigned char)fromLim[-1];
    if ((prev & 0xf8u) == 0xf0u) { /* 4-byte character, lead by 0b11110xxx byte */
      if (walked + 1 >= 4) {
        fromLim += 4 - 1;
        break;
      } else {
        walked = 0;
      }
    } else if ((prev & 0xf0u) == 0xe0u) { /* 3-byte character, lead by 0b1110xxxx byte */
      if (walked + 1 >= 3) {
        fromLim += 3 - 1;
        break;
      } else {
        walked = 0;
      }
    } else if ((prev & 0xe0u) == 0xc0u) { /* 2-byte character, lead by 0b110xxxxx byte */
      if (walked + 1 >= 2) {
        fromLim += 2 - 1;
        break;
      } else {
        walked = 0;
      }
    } else if ((prev & 0x80u) == 0x00u) { /* 1-byte character, matching 0b0xxxxxxx */
      break;
    }
  }
  *fromLimRef = fromLim;
}